

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O3

void __thiscall
gmath::RadialTangentialDistortion::RadialTangentialDistortion
          (RadialTangentialDistortion *this,int n)

{
  int iVar1;
  
  (this->super_Distortion)._vptr_Distortion = (_func_int **)&PTR__Distortion_00177a38;
  iVar1 = 3;
  if (n < 3) {
    iVar1 = n;
  }
  this->kn = iVar1;
  this->kd[0] = 0.0;
  this->kd[1] = 0.0;
  this->kd[2] = 0.0;
  this->kd[3] = 0.0;
  this->kd[4] = 0.0;
  return;
}

Assistant:

RadialTangentialDistortion::RadialTangentialDistortion(int n)
{
  n=std::min(n, 3);

  kn=n;
  kd[0]=0;
  kd[1]=0;
  kd[2]=0;
  kd[3]=0;
  kd[4]=0;
}